

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poly.cpp
# Opt level: O2

void __thiscall
MT32Emu::Poly::reset(Poly *this,uint newKey,uint newVelocity,bool newSustain,Partial **newPartials)

{
  Partial *pPVar1;
  bool bVar2;
  Synth *this_00;
  long lVar3;
  
  if (this->state != POLY_Inactive) {
    this_00 = Part::getSynth(this->part);
    Synth::printDebug(this_00,"Resetting active poly. Active partial count: %i\n",
                      (ulong)this->activePartialCount);
    for (lVar3 = 4; lVar3 != 8; lVar3 = lVar3 + 1) {
      if (this->partials[lVar3 + -4] != (Partial *)0x0) {
        bVar2 = Partial::isActive(this->partials[lVar3 + -4]);
        if (bVar2) {
          Partial::deactivate(this->partials[lVar3 + -4]);
          this->activePartialCount = this->activePartialCount - 1;
        }
      }
    }
    setState(this,POLY_Inactive);
  }
  this->key = newKey;
  this->velocity = newVelocity;
  this->sustain = newSustain;
  this->activePartialCount = 0;
  for (lVar3 = 4; lVar3 != 8; lVar3 = lVar3 + 1) {
    pPVar1 = newPartials[lVar3 + -4];
    this->partials[lVar3 + -4] = pPVar1;
    if (pPVar1 != (Partial *)0x0) {
      this->activePartialCount = this->activePartialCount + 1;
      setState(this,POLY_Playing);
    }
  }
  return;
}

Assistant:

void Poly::reset(unsigned int newKey, unsigned int newVelocity, bool newSustain, Partial **newPartials) {
	if (isActive()) {
		// This should never happen
		part->getSynth()->printDebug("Resetting active poly. Active partial count: %i\n", activePartialCount);
		for (int i = 0; i < 4; i++) {
			if (partials[i] != NULL && partials[i]->isActive()) {
				partials[i]->deactivate();
				activePartialCount--;
			}
		}
		setState(POLY_Inactive);
	}

	key = newKey;
	velocity = newVelocity;
	sustain = newSustain;

	activePartialCount = 0;
	for (int i = 0; i < 4; i++) {
		partials[i] = newPartials[i];
		if (newPartials[i] != NULL) {
			activePartialCount++;
			setState(POLY_Playing);
		}
	}
}